

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked-list.cpp
# Opt level: O2

void __thiscall LinkedList::printList(LinkedList *this,Node *head)

{
  Node *pNVar1;
  ostream *poVar2;
  ostream *poVar3;
  
  if (head == (Node *)0x0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Empty Linked List");
  }
  else {
    pNVar1 = head->next;
    if (pNVar1 != (Node *)0x0) {
      while (pNVar1 != (Node *)0x0) {
        poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,head->data);
        std::operator<<(poVar2," -> ");
        head = head->next;
        pNVar1 = head->next;
      }
    }
    poVar2 = (ostream *)&std::cout;
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,head->data);
    std::operator<<(poVar3," -> ");
  }
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

void LinkedList::printList(Node* head) {
	Node* n = head;

	if (n == NULL) {
		std::cout << "Empty Linked List" << std::endl;
		return;
	}

	if (n->next == nullptr) {
		// Print last number in linked list
		std::cout << n->data << " -> ";
	}
	else {
		while (n->next != NULL) {
			std::cout << n->data << " -> ";
			n = n->next;
		}
		// Print last number in linked list
		std::cout << n->data << " -> ";
	}

	// Create new line
	std::cout << std::endl;
}